

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O2

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::parseNamespaceDeclarations
          (ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserAttributes *attributes)

{
  _Base_ptr p_Var1;
  StringHash SVar2;
  StringHash *pSVar3;
  xmlChar **ppxVar4;
  _Elt_pointer pNVar5;
  StringHashPair SVar6;
  StringHash name;
  NamespaceStackFrame stackFrame;
  unsigned_long local_70;
  value_type local_68;
  key_type local_30;
  
  ppxVar4 = attributes->attributes;
  if (ppxVar4 != (xmlChar **)0x0) {
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68.counter = 0;
    pNVar5 = (this->mNamespacesStack).c.
             super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pNVar5 != (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pNVar5 == (this->mNamespacesStack).c.
                    super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar5 = (this->mNamespacesStack).c.
                 super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      for (p_Var1 = pNVar5[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var1 != &pNVar5[-1].namespaces._M_t._M_impl.super__Rb_tree_header;
          p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
        ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_long>const&>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                    *)&local_68,(pair<const_unsigned_long,_unsigned_long> *)(p_Var1 + 1));
      }
    }
    for (; *ppxVar4 != (ParserChar *)0x0; ppxVar4 = ppxVar4 + 2) {
      SVar6 = Utils::calculateStringHashWithNamespace(*ppxVar4);
      local_70 = SVar6.second;
      if (local_70 == 0x7f4353 && SVar6.first == 0) {
        SVar2 = Utils::calculateStringHash(ppxVar4[1]);
        local_30 = 0;
        pSVar3 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](&local_68.namespaces,&local_30);
LAB_007015d2:
        *pSVar3 = SVar2;
      }
      else if (SVar6.first == 0x7f4353) {
        SVar2 = Utils::calculateStringHash(ppxVar4[1]);
        pSVar3 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](&local_68.namespaces,&local_70);
        goto LAB_007015d2;
      }
    }
    if (local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ::push_back(&(this->mNamespacesStack).c,&local_68);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)&local_68);
  }
  return;
}

Assistant:

void ParserTemplate<DerivedClass, ImplClass>::parseNamespaceDeclarations( const ParserAttributes& attributes )
    {
        const ParserChar** attributeArray = attributes.attributes;
        if ( attributeArray )
        {
            NamespaceStackFrame stackFrame;
            if ( !mNamespacesStack.empty() )
            {
                const NamespaceStackFrame& topElement = mNamespacesStack.top();
                typename NamespacePrefixesMap::const_iterator it = topElement.namespaces.begin();
                for (; it != topElement.namespaces.end(); ++it)
                {
                    stackFrame.namespaces.insert(*it);
                }
            }
            while (true)
            {
                const ParserChar * attribute = *attributeArray;
                if ( !attribute )
                    break;
                StringHashPair hashPair = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(attribute);
                attributeArray++;
                if ( !attributeArray )
                    return;
                const ParserChar* attributeValue = *attributeArray;
                attributeArray++;

                StringHash prefix = hashPair.first;
                StringHash name = hashPair.second;
                if ( prefix == 0 && name == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set default namespace
                    stackFrame.namespaces[ 0 ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
                else if ( prefix == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set namespace with prefix
                    stackFrame.namespaces[ name ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
            }
            if ( !stackFrame.namespaces.empty() )
            {
                mNamespacesStack.push( stackFrame );
            }
        }
    }